

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  SerialArena *this_00;
  SerialArena *cleanup_00;
  _func_void_void_ptr *elem_00;
  bool bVar1;
  ThreadCache *me;
  AllocationPolicy *policy;
  SerialArena *local_28;
  SerialArena *arena;
  _func_void_void_ptr *cleanup_local;
  void *elem_local;
  ThreadSafeArena *this_local;
  
  arena = (SerialArena *)cleanup;
  cleanup_local = (_func_void_void_ptr *)elem;
  elem_local = this;
  bVar1 = GetSerialArenaFast(this,&local_28);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    me = thread_cache();
    local_28 = GetSerialArenaFallback(this,me);
  }
  elem_00 = cleanup_local;
  cleanup_00 = arena;
  this_00 = local_28;
  policy = AllocPolicy(this);
  SerialArena::AddCleanup(this_00,elem_00,(_func_void_void_ptr *)cleanup_00,policy);
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_FALSE(!GetSerialArenaFast(&arena))) {
    arena = GetSerialArenaFallback(&thread_cache());
  }
  arena->AddCleanup(elem, cleanup, AllocPolicy());
}